

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_recv_cack(udp_ep *ep,udp_sp_creq *cack,nng_sockaddr *sa)

{
  udp_pipe *p_00;
  nni_time nVar1;
  bool bVar2;
  nni_time now;
  _Bool first;
  udp_pipe *p;
  nng_sockaddr *sa_local;
  udp_sp_creq *cack_local;
  udp_ep *ep_local;
  
  p_00 = udp_find_pipe(ep,cack->us_peer_id,cack->us_sender_id);
  if ((p_00 == (udp_pipe *)0x0) || ((p_00->closed & 1U) != 0)) {
    udp_send_disc_full(ep,sa,cack->us_peer_id,cack->us_sender_id,0,DISC_NOTCONN);
  }
  else if ((p_00->peer_id == 0) || (p_00->peer == cack->us_type)) {
    bVar2 = p_00->peer_id == 0;
    p_00->sndmax = cack->us_recv_max;
    p_00->peer = cack->us_type;
    p_00->peer_id = cack->us_sender_id;
    if (cack->us_refresh == '\0') {
      udp_send_disc(ep,p_00,DISC_NEGO);
    }
    else {
      if (bVar2) {
        p_00->refresh = ep->refresh;
        p_00->peer_seq = cack->us_sequence + 1;
      }
      if ((int)((uint)cack->us_refresh * 1000) < p_00->refresh) {
        p_00->refresh = (uint)cack->us_refresh * 1000;
      }
      nVar1 = nni_clock();
      p_00->next_wake = nVar1 + (long)p_00->refresh;
      p_00->expire = nVar1 + (long)(p_00->refresh * 5);
      udp_pipe_schedule(p_00);
      if (bVar2) {
        nni_list_append(&ep->connpipes,p_00);
        udp_ep_match(ep);
      }
    }
  }
  else {
    udp_send_disc(ep,p_00,DISC_TYPE);
  }
  return;
}

Assistant:

static void
udp_recv_cack(udp_ep *ep, udp_sp_creq *cack, nng_sockaddr *sa)
{
	udp_pipe *p;
	bool      first;
	nni_time  now;

	if ((p = udp_find_pipe(ep, cack->us_peer_id, cack->us_sender_id)) &&
	    (!p->closed)) {
		if ((p->peer_id != 0) && (p->peer != cack->us_type)) {
			udp_send_disc(ep, p, DISC_TYPE);
			return;
		}

		first = (p->peer_id == 0);

		// so we know who it is from.. this is a refresh.
		p->sndmax  = cack->us_recv_max;
		p->peer    = cack->us_type;
		p->peer_id = cack->us_sender_id;

		if (cack->us_refresh == 0) {
			udp_send_disc(ep, p, DISC_NEGO);
			return;
		}
		if (first) {
			p->refresh  = ep->refresh;
			p->peer_seq = cack->us_sequence + 1;
		}
		if ((cack->us_refresh * NNI_SECOND) < p->refresh) {
			p->refresh = cack->us_refresh * NNI_SECOND;
		}
		now          = nni_clock();
		p->next_wake = now + UDP_PIPE_REFRESH(p);
		p->expire    = now + UDP_PIPE_TIMEOUT(p);
		udp_pipe_schedule(p);

		if (first) {
			nni_list_append(&ep->connpipes, p);
			udp_ep_match(ep);
		}
		return;
	}

	// a CACK without a corresponding CREQ (or timed out pipe already)
	udp_send_disc_full(
	    ep, sa, cack->us_peer_id, cack->us_sender_id, 0, DISC_NOTCONN);
}